

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O1

void mahjong::adjust_by_suits(tile_t *tiles,intptr_t tile_cnt,fan_table_t *fan_table)

{
  tile_t *ptVar1;
  byte bVar2;
  long lVar3;
  tile_t *ptVar4;
  tile_t *ptVar5;
  long lVar6;
  
  if (tile_cnt < 1) {
    bVar2 = 0;
  }
  else {
    lVar3 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | (byte)(1 << (tiles[lVar3] >> 4));
      lVar3 = lVar3 + 1;
    } while (tile_cnt != lVar3);
  }
  if ((bVar2 & 0xf1) == 0) {
    (*fan_table)[0x4c] = 1;
  }
  if ((bVar2 & 0xe3) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((bVar2 & 0xe5) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((bVar2 & 0xe9) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((*fan_table)[0x4b] == 2) {
    (*fan_table)[0x4b] = 0;
    lVar3 = 0x62;
    if ((bVar2 & 0xf1) == 0) {
      lVar3 = 0x2c;
    }
    *(undefined2 *)((long)*fan_table + lVar3) = 1;
  }
  if (bVar2 != 0x1e) {
    return;
  }
  ptVar1 = tiles + tile_cnt;
  lVar3 = tile_cnt >> 2;
  ptVar4 = tiles;
  if (0 < lVar3) {
    ptVar4 = tiles + (tile_cnt & 0xfffffffffffffffc);
    lVar6 = lVar3 + 1;
    ptVar5 = tiles + 3;
    do {
      if ((byte)(ptVar5[-3] + 0xbf) < 4) {
        ptVar5 = ptVar5 + -3;
        goto LAB_0011f91a;
      }
      if ((byte)(ptVar5[-2] + 0xbf) < 4) {
        ptVar5 = ptVar5 + -2;
        goto LAB_0011f91a;
      }
      if ((byte)(ptVar5[-1] + 0xbf) < 4) {
        ptVar5 = ptVar5 + -1;
        goto LAB_0011f91a;
      }
      if ((byte)(*ptVar5 + 0xbf) < 4) goto LAB_0011f91a;
      lVar6 = lVar6 + -1;
      ptVar5 = ptVar5 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)ptVar1 - (long)ptVar4;
  if (lVar6 == 1) {
LAB_0011f907:
    ptVar5 = ptVar4;
    if (3 < (byte)(*ptVar4 + 0xbf)) {
      ptVar5 = ptVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_0011f8e1:
    ptVar5 = ptVar4;
    if (3 < (byte)(*ptVar4 + 0xbf)) {
      ptVar4 = ptVar4 + 1;
      goto LAB_0011f907;
    }
  }
  else {
    ptVar5 = ptVar1;
    if ((lVar6 == 3) && (ptVar5 = ptVar4, 3 < (byte)(*ptVar4 + 0xbf))) {
      ptVar4 = ptVar4 + 1;
      goto LAB_0011f8e1;
    }
  }
LAB_0011f91a:
  if (ptVar5 == ptVar1) {
    return;
  }
  ptVar4 = tiles;
  if (0 < lVar3) {
    ptVar4 = tiles + (tile_cnt & 0xfffffffffffffffc);
    lVar3 = lVar3 + 1;
    ptVar5 = tiles + 3;
    do {
      if ((byte)(ptVar5[-3] + 0xbb) < 3) {
        ptVar5 = ptVar5 + -3;
        goto LAB_0011f9db;
      }
      if ((byte)(ptVar5[-2] + 0xbb) < 3) {
        ptVar5 = ptVar5 + -2;
        goto LAB_0011f9db;
      }
      if ((byte)(ptVar5[-1] + 0xbb) < 3) {
        ptVar5 = ptVar5 + -1;
        goto LAB_0011f9db;
      }
      if ((byte)(*ptVar5 + 0xbb) < 3) goto LAB_0011f9db;
      lVar3 = lVar3 + -1;
      ptVar5 = ptVar5 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)ptVar1 - (long)ptVar4;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      ptVar5 = ptVar1;
      if ((lVar3 != 3) || (ptVar5 = ptVar4, (byte)(*ptVar4 + 0xbb) < 3)) goto LAB_0011f9db;
      ptVar4 = ptVar4 + 1;
    }
    ptVar5 = ptVar4;
    if ((byte)(*ptVar4 + 0xbb) < 3) goto LAB_0011f9db;
    ptVar4 = ptVar4 + 1;
  }
  ptVar5 = ptVar4;
  if (2 < (byte)(*ptVar4 + 0xbb)) {
    ptVar5 = ptVar1;
  }
LAB_0011f9db:
  if (ptVar5 != ptVar1) {
    (*fan_table)[0x33] = 1;
  }
  return;
}

Assistant:

static void adjust_by_suits(const tile_t *tiles, intptr_t tile_cnt, fan_table_t &fan_table) {
    // 打表标记有哪些花色，用bit操作
    uint8_t suit_flag = 0;
    for (intptr_t i = 0; i < tile_cnt; ++i) {
        suit_flag |= (1 << tile_get_suit(tiles[i]));
    }

    // 1111 0001
    if (!(suit_flag & 0xF1U)) {
        fan_table[NO_HONORS] = 1;  // 无字
    }

    // 1110 0011
    if (!(suit_flag & 0xE3U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（万）
    }
    // 1110 0101
    if (!(suit_flag & 0xE5U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（条）
    }
    // 1110 1001
    if (!(suit_flag & 0xE9U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（饼）
    }

    // 当缺2门时，根据有字和无字，修正为混一色和清一色
    if (fan_table[ONE_VOIDED_SUIT] == 2) {
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[suit_flag & 0xF1U ? HALF_FLUSH : FULL_FLUSH] = 1;
    }

    // 0001 1110
    if (suit_flag == 0x1EU) {  // 三门数牌和字牌都有
        if (std::any_of(tiles, tiles + tile_cnt, &is_winds)
            && std::any_of(tiles, tiles + tile_cnt, &is_dragons)) {
            fan_table[ALL_TYPES] = 1;  // 五门齐
        }
    }
}